

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O3

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Float_(ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
         *this)

{
  Position *this_00;
  int *piVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  byte *pbVar5;
  
  pbVar5 = (byte *)(this->m_position).m_pos;
  if ((pbVar5 != (byte *)(this->m_position).m_end) &&
     (m_alphabet._M_elems[3]._M_elems[*pbVar5] == true)) {
    this_00 = &this->m_position;
    do {
      bVar2 = *pbVar5;
      if (m_alphabet._M_elems[2]._M_elems[bVar2] != true) {
        iVar4 = tolower((int)(char)bVar2);
        if (iVar4 == 0x65) goto LAB_004a31d2;
        if (bVar2 != 0x2e) {
          return false;
        }
        Position::operator++(this_00);
        pbVar5 = (byte *)(this->m_position).m_pos;
        if ((pbVar5 == (byte *)(this->m_position).m_end) ||
           (m_alphabet._M_elems[2]._M_elems[*pbVar5] != true)) {
          (this->m_position).m_pos = (char *)(pbVar5 + -1);
          if (pbVar5[-1] == 10) {
            (this->m_position).line = (this->m_position).line + -1;
            (this->m_position).col = (this->m_position).m_last_col;
            return false;
          }
          piVar1 = &(this->m_position).col;
          *piVar1 = *piVar1 + -1;
          return false;
        }
        goto LAB_004a320b;
      }
      Position::operator++(this_00);
      pbVar5 = (byte *)(this->m_position).m_pos;
    } while (pbVar5 != (byte *)(this->m_position).m_end);
  }
  return false;
  while( true ) {
    Position::operator++(this_00);
    pbVar5 = (byte *)(this->m_position).m_pos;
    if (pbVar5 == (byte *)(this->m_position).m_end) break;
LAB_004a320b:
    if (m_alphabet._M_elems[2]._M_elems[*pbVar5] != true) break;
  }
LAB_004a31d2:
  bVar3 = read_exponent_and_suffix(this);
  return bVar3;
}

Assistant:

constexpr bool has_more() const noexcept { return m_pos != m_end; }